

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
google::protobuf::FatalException::FatalException
          (FatalException *this,char *filename,int line,string *message)

{
  string *message_local;
  int line_local;
  char *filename_local;
  FatalException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__FatalException_006f8af8;
  this->filename_ = filename;
  this->line_ = line;
  std::__cxx11::string::string((string *)&this->message_,(string *)message);
  return;
}

Assistant:

FatalException(const char* filename, int line, const std::string& message)
      : filename_(filename), line_(line), message_(message) {}